

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

XMLUnknown * __thiscall
tinyxml2::XMLDocument::CreateUnlinkedNode<tinyxml2::XMLUnknown,104>
          (XMLDocument *this,MemPoolT<104> *pool)

{
  int iVar1;
  undefined4 extraout_var;
  XMLNode *t;
  
  iVar1 = (*(pool->super_MemPool)._vptr_MemPool[3])(pool);
  t = (XMLNode *)CONCAT44(extraout_var,iVar1);
  t->_document = this;
  t->_parent = (XMLNode *)0x0;
  (t->_value)._flags = 0;
  (t->_value)._start = (char *)0x0;
  (t->_value)._end = (char *)0x0;
  t->_parseLineNum = 0;
  t->_firstChild = (XMLNode *)0x0;
  t->_lastChild = (XMLNode *)0x0;
  t->_prev = (XMLNode *)0x0;
  t->_next = (XMLNode *)0x0;
  t->_userData = (void *)0x0;
  t->_vptr_XMLNode = (_func_int **)&PTR_ToElement_001b0560;
  t->_memPool = &pool->super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::Push(&this->_unlinked,t);
  return (XMLUnknown *)t;
}

Assistant:

inline NodeType* XMLDocument::CreateUnlinkedNode(MemPoolT<PoolElementSize>& pool)
{
    TIXMLASSERT(sizeof(NodeType) == PoolElementSize);
    TIXMLASSERT(sizeof(NodeType) == pool.ItemSize());
    NodeType* returnNode = new (pool.Alloc()) NodeType(this);
    TIXMLASSERT(returnNode);
    returnNode->_memPool = &pool;

    _unlinked.Push(returnNode);
    return returnNode;
}